

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UintTypes.cpp
# Opt level: O3

string * __thiscall
jbcoin::to_string_abi_cxx11_(string *__return_storage_ptr__,jbcoin *this,Currency *currency)

{
  ulong uVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  size_t __n;
  uint32_t *puVar3;
  int iVar4;
  long lVar5;
  ulong uVar6;
  Currency *pCVar7;
  Currency *pCVar8;
  pointer __s1;
  uint local_38 [6];
  
  if ((to_string[abi:cxx11](jbcoin::base_uint<160ul,jbcoin::detail::CurrencyTag>const&)::
       allowed_characters_abi_cxx11_ == '\0') &&
     (iVar4 = __cxa_guard_acquire(&to_string[abi:cxx11](jbcoin::base_uint<160ul,jbcoin::detail::CurrencyTag>const&)
                                   ::allowed_characters_abi_cxx11_), iVar4 != 0)) {
    to_string[abi:cxx11](jbcoin::base_uint<160ul,jbcoin::detail::CurrencyTag>const&)::
    allowed_characters_abi_cxx11_._M_dataplus._M_p =
         (pointer)&to_string[abi:cxx11](jbcoin::base_uint<160ul,jbcoin::detail::CurrencyTag>const&)
                   ::allowed_characters_abi_cxx11_.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)
               &to_string[abi:cxx11](jbcoin::base_uint<160ul,jbcoin::detail::CurrencyTag>const&)::
                allowed_characters_abi_cxx11_,
               "abcdefghijklmnopqrstuvwxyzABCDEFGHIJKLMNOPQRSTUVWXYZ0123456789<>(){}[]|?!@#$%^&*",""
              );
    __cxa_atexit(std::__cxx11::string::~string,
                 &to_string[abi:cxx11](jbcoin::base_uint<160ul,jbcoin::detail::CurrencyTag>const&)::
                  allowed_characters_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&to_string[abi:cxx11](jbcoin::base_uint<160ul,jbcoin::detail::CurrencyTag>const&)
                         ::allowed_characters_abi_cxx11_);
  }
  if (*(int *)this == 0) {
    uVar6 = 0xffffffffffffffff;
    do {
      if (uVar6 == 3) goto LAB_001a4ef4;
      uVar1 = uVar6 + 1;
      lVar5 = uVar6 * 4;
      uVar6 = uVar1;
    } while (*(int *)(this + lVar5 + 8) == 0);
    if (3 < uVar1) {
LAB_001a4ef4:
      if (systemCurrencyCode[abi:cxx11]()::code_abi_cxx11_ == '\0') {
        to_string_abi_cxx11_();
      }
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)__return_storage_ptr__,systemCurrencyCode[abi:cxx11]()::code_abi_cxx11_,
                 DAT_002e0a68 + (long)systemCurrencyCode[abi:cxx11]()::code_abi_cxx11_);
      return __return_storage_ptr__;
    }
  }
  noCurrency();
  lVar5 = 0;
  while (this[lVar5] == *(jbcoin *)((long)noCurrency::currency.pn + lVar5)) {
    lVar5 = lVar5 + 1;
    if (lVar5 == 0x14) {
LAB_001a4f2a:
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"1","");
      return __return_storage_ptr__;
    }
  }
  if (lVar5 == 0x14) goto LAB_001a4f2a;
  if ((to_string[abi:cxx11](jbcoin::base_uint<160ul,jbcoin::detail::CurrencyTag>const&)::sIsoBits ==
       '\0') &&
     (iVar4 = __cxa_guard_acquire(&to_string[abi:cxx11](jbcoin::base_uint<160ul,jbcoin::detail::CurrencyTag>const&)
                                   ::sIsoBits), iVar4 != 0)) {
    to_string::sIsoBits.pn[0] = 0;
    to_string::sIsoBits.pn[1] = 0;
    to_string::sIsoBits.pn[2] = 0;
    to_string::sIsoBits.pn[3] = 0;
    to_string::sIsoBits.pn[4] = 0;
    base_uint<160UL,_jbcoin::detail::CurrencyTag>::SetHex
              (&to_string::sIsoBits,"FFFFFFFFFFFFFFFFFFFFFFFF000000FFFFFFFFFF",false);
    __cxa_guard_release(&to_string[abi:cxx11](jbcoin::base_uint<160ul,jbcoin::detail::CurrencyTag>const&)
                         ::sIsoBits);
  }
  local_38[4] = *(undefined4 *)(this + 0x10);
  local_38[0] = *(uint *)this;
  local_38[1] = *(undefined4 *)(this + 4);
  local_38[2] = *(undefined4 *)(this + 8);
  local_38[3] = *(undefined4 *)(this + 0xc);
  lVar5 = 0;
  pCVar8 = &to_string::sIsoBits;
  do {
    *(uint *)((long)local_38 + lVar5) =
         *(uint *)((long)local_38 + lVar5) & *(uint *)((long)to_string::sIsoBits.pn + lVar5);
    lVar5 = lVar5 + 4;
  } while (lVar5 != 0x14);
  if (local_38[0] == 0) {
    pCVar7 = (Currency *)0xffffffffffffffff;
    do {
      if (pCVar7 == (Currency *)0x3) goto LAB_001a4fc6;
      pCVar8 = (Currency *)((long)pCVar7->pn + 1);
      puVar3 = pCVar7->pn;
      pCVar7 = pCVar8;
    } while (local_38[(long)((long)puVar3 + 2)] == 0);
    if (pCVar8 < (Currency *)0x4) goto LAB_001a4f86;
LAB_001a4fc6:
    paVar2 = &__return_storage_ptr__->field_2;
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<unsigned_char_const*>
              ((string *)__return_storage_ptr__,this + 0xc,this + 0xf);
    if (systemCurrencyCode[abi:cxx11]()::code_abi_cxx11_ == '\0') {
      to_string_abi_cxx11_();
    }
    __n = __return_storage_ptr__->_M_string_length;
    if ((__n != DAT_002e0a68) ||
       ((__s1 = (__return_storage_ptr__->_M_dataplus)._M_p, __n != 0 &&
        (iVar4 = bcmp(__s1,systemCurrencyCode[abi:cxx11]()::code_abi_cxx11_,__n), iVar4 != 0)))) {
      pCVar8 = (Currency *)
               to_string[abi:cxx11](jbcoin::base_uint<160ul,jbcoin::detail::CurrencyTag>const&)::
               allowed_characters_abi_cxx11_._M_string_length;
      lVar5 = std::__cxx11::string::find_first_not_of
                        ((char *)__return_storage_ptr__,
                         (ulong)to_string[abi:cxx11](jbcoin::base_uint<160ul,jbcoin::detail::CurrencyTag>const&)
                                ::allowed_characters_abi_cxx11_._M_dataplus._M_p,0);
      if (lVar5 == -1) {
        return __return_storage_ptr__;
      }
      __s1 = (__return_storage_ptr__->_M_dataplus)._M_p;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)__s1 != paVar2) {
      operator_delete(__s1,paVar2->_M_allocated_capacity + 1);
    }
  }
LAB_001a4f86:
  strHex<unsigned_char_const*>(__return_storage_ptr__,this,(uchar *)0x14,(int)pCVar8);
  return __return_storage_ptr__;
}

Assistant:

std::string to_string(Currency const& currency)
{
    // Characters we are willing to allow in the ASCII representation of a
    // three-letter currency code.
    static std::string const allowed_characters =
        "abcdefghijklmnopqrstuvwxyz"
        "ABCDEFGHIJKLMNOPQRSTUVWXYZ"
        "0123456789"
        "<>(){}[]|?!@#$%^&*";

    if (currency == zero)
        return systemCurrencyCode();

    if (currency == noCurrency())
        return "1";

    static Currency const sIsoBits (
        from_hex_text<Currency>("FFFFFFFFFFFFFFFFFFFFFFFF000000FFFFFFFFFF"));

    if ((currency & sIsoBits).isZero ())
    {
        // The offset of the 3 character ISO code in the currency descriptor
        int const isoOffset = 12;

        std::string const iso(
            currency.data () + isoOffset,
            currency.data () + isoOffset + 3);

        // Specifying the system currency code using ISO-style representation
        // is not allowed.
        if ((iso != systemCurrencyCode()) &&
            (iso.find_first_not_of (allowed_characters) == std::string::npos))
        {
            return iso;
        }
    }

    return strHex (currency.begin (), currency.size ());
}